

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageRestrictionManager.cpp
# Opt level: O2

ssize_t __thiscall
jaegertracing::thrift::BaggageRestrictionManager_getBaggageRestrictions_presult::read
          (BaggageRestrictionManager_getBaggageRestrictions_presult *this,int __fd,void *__buf,
          size_t __nbytes)

{
  pointer pBVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  long lVar6;
  int16_t fid;
  uint32_t _size8;
  TType ftype;
  TType _etype11;
  string fname;
  short local_5e;
  uint local_5c;
  int local_58;
  undefined1 local_54 [4];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar2 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  do {
    iVar3 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_58,&local_5e);
    iVar3 = iVar3 + iVar2;
    if (local_58 == 0) {
      iVar2 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      std::__cxx11::string::~string((string *)&local_50);
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar2 + iVar3);
    }
    if (local_5e == 0) {
      if (local_58 != 0xf) {
        iVar4 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
        goto LAB_00223c73;
      }
      std::
      vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
      ::clear(this->success);
      iVar2 = (*this_00->_vptr_TProtocol[0x1f])(this_00,local_54,&local_5c);
      std::
      vector<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
      ::resize(this->success,(ulong)local_5c);
      iVar2 = iVar2 + iVar3;
      lVar6 = 0;
      for (uVar5 = 0; uVar5 < local_5c; uVar5 = uVar5 + 1) {
        pBVar1 = (this->success->
                 super__Vector_base<jaegertracing::thrift::BaggageRestriction,_std::allocator<jaegertracing::thrift::BaggageRestriction>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar3 = (**(code **)(*(long *)(&pBVar1->field_0x0 + lVar6) + 0x10))
                          (&pBVar1->field_0x0 + lVar6,this_00);
        iVar2 = iVar2 + iVar3;
        lVar6 = lVar6 + 0x30;
      }
      iVar4 = (*this_00->_vptr_TProtocol[0x20])(this_00);
      iVar4 = iVar4 + iVar2;
      this->__isset =
           (_BaggageRestrictionManager_getBaggageRestrictions_presult__isset)
           ((byte)this->__isset | 1);
    }
    else {
      iVar4 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
LAB_00223c73:
      iVar4 = iVar4 + iVar3;
    }
    iVar2 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar2 = iVar2 + iVar4;
  } while( true );
}

Assistant:

uint32_t BaggageRestrictionManager_getBaggageRestrictions_presult::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 0:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            (*(this->success)).clear();
            uint32_t _size8;
            ::apache::thrift::protocol::TType _etype11;
            xfer += iprot->readListBegin(_etype11, _size8);
            (*(this->success)).resize(_size8);
            uint32_t _i12;
            for (_i12 = 0; _i12 < _size8; ++_i12)
            {
              xfer += (*(this->success))[_i12].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.success = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}